

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pprinter.cc
# Opt level: O0

string * __thiscall
tinyusdz::to_string_abi_cxx11_
          (string *__return_storage_ptr__,tinyusdz *this,SkelRoot *root,uint32_t indent,
          bool closing_brace)

{
  bool bVar1;
  ostream *poVar2;
  TypedAttributeWithFallback<tinyusdz::Animatable<tinyusdz::Visibility>_> *attr;
  TypedAttributeWithFallback<tinyusdz::Purpose> *attr_00;
  TypedAttribute<tinyusdz::Animatable<tinyusdz::Extent>_> *attr_01;
  value_type *rel;
  value_type *this_00;
  uint32_t indent_00;
  uint32_t uVar3;
  string *psVar4;
  uint32_t n;
  Specifier s;
  uint32_t n_00;
  uint32_t n_01;
  uint32_t extraout_EDX;
  uint32_t n_02;
  string local_3f0;
  string local_3d0;
  string local_3b0;
  allocator local_389;
  string local_388;
  ListEditQual local_364;
  string local_360;
  allocator local_339;
  string local_338;
  string local_318;
  allocator local_2f1;
  string local_2f0;
  string local_2d0;
  allocator local_2a9;
  string local_2a8;
  string local_288;
  string local_268;
  string local_248;
  string local_228;
  string local_208;
  string local_1e8;
  string local_1c8;
  stringstream local_1a8 [8];
  stringstream ss;
  ostream aoStack_198 [379];
  byte local_1d;
  uint local_1c;
  bool closing_brace_local;
  tinyusdz *ptStack_18;
  uint32_t indent_local;
  SkelRoot *root_local;
  
  local_1c = (uint)root;
  local_1d = (byte)indent & 1;
  psVar4 = __return_storage_ptr__;
  ptStack_18 = this;
  root_local = (SkelRoot *)__return_storage_ptr__;
  std::__cxx11::stringstream::stringstream(local_1a8);
  indent_00 = (uint32_t)psVar4;
  pprint::Indent_abi_cxx11_(&local_1c8,(pprint *)(ulong)local_1c,n);
  poVar2 = std::operator<<(aoStack_198,(string *)&local_1c8);
  to_string_abi_cxx11_(&local_1e8,(tinyusdz *)(ulong)*(uint *)(ptStack_18 + 0xc0),s);
  poVar2 = std::operator<<(poVar2,(string *)&local_1e8);
  poVar2 = std::operator<<(poVar2," SkelRoot \"");
  poVar2 = std::operator<<(poVar2,(string *)(ptStack_18 + 0xa0));
  std::operator<<(poVar2,"\"\n");
  std::__cxx11::string::~string((string *)&local_1e8);
  std::__cxx11::string::~string((string *)&local_1c8);
  bVar1 = PrimMetas::authored((PrimMetas *)(ptStack_18 + 3000));
  uVar3 = n_00;
  if (bVar1) {
    pprint::Indent_abi_cxx11_(&local_208,(pprint *)(ulong)local_1c,n_00);
    poVar2 = std::operator<<(aoStack_198,(string *)&local_208);
    std::operator<<(poVar2,"(\n");
    std::__cxx11::string::~string((string *)&local_208);
    print_prim_metas_abi_cxx11_
              (&local_228,ptStack_18 + 3000,(PrimMeta *)(ulong)(local_1c + 1),indent_00);
    std::operator<<(aoStack_198,(string *)&local_228);
    std::__cxx11::string::~string((string *)&local_228);
    pprint::Indent_abi_cxx11_(&local_248,(pprint *)(ulong)local_1c,n_01);
    poVar2 = std::operator<<(aoStack_198,(string *)&local_248);
    std::operator<<(poVar2,")\n");
    std::__cxx11::string::~string((string *)&local_248);
    uVar3 = extraout_EDX;
  }
  pprint::Indent_abi_cxx11_(&local_268,(pprint *)(ulong)local_1c,uVar3);
  poVar2 = std::operator<<(aoStack_198,(string *)&local_268);
  std::operator<<(poVar2,"{\n");
  std::__cxx11::string::~string((string *)&local_268);
  attr = (TypedAttributeWithFallback<tinyusdz::Animatable<tinyusdz::Visibility>_> *)
         (ptStack_18 + 0x580);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_2a8,"visibility",&local_2a9);
  print_typed_token_attr<tinyusdz::Visibility>(&local_288,attr,&local_2a8,local_1c + 1);
  std::operator<<(aoStack_198,(string *)&local_288);
  std::__cxx11::string::~string((string *)&local_288);
  std::__cxx11::string::~string((string *)&local_2a8);
  std::allocator<char>::~allocator((allocator<char> *)&local_2a9);
  attr_00 = (TypedAttributeWithFallback<tinyusdz::Purpose> *)(ptStack_18 + 0x348);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_2f0,"purpose",&local_2f1);
  print_typed_token_attr<tinyusdz::Purpose>(&local_2d0,attr_00,&local_2f0,local_1c + 1);
  std::operator<<(aoStack_198,(string *)&local_2d0);
  std::__cxx11::string::~string((string *)&local_2d0);
  std::__cxx11::string::~string((string *)&local_2f0);
  std::allocator<char>::~allocator((allocator<char> *)&local_2f1);
  attr_01 = (TypedAttribute<tinyusdz::Animatable<tinyusdz::Extent>_> *)(ptStack_18 + 0xd0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_338,"extent",&local_339);
  uVar3 = local_1c + 1;
  print_typed_attr<tinyusdz::Extent>(&local_318,attr_01,&local_338,uVar3);
  std::operator<<(aoStack_198,(string *)&local_318);
  std::__cxx11::string::~string((string *)&local_318);
  std::__cxx11::string::~string((string *)&local_338);
  std::allocator<char>::~allocator((allocator<char> *)&local_339);
  bVar1 = nonstd::optional_lite::optional::operator_cast_to_bool((optional *)(ptStack_18 + 0x808));
  if (bVar1) {
    rel = nonstd::optional_lite::optional<tinyusdz::Relationship>::value
                    ((optional<tinyusdz::Relationship> *)(ptStack_18 + 0x808));
    this_00 = nonstd::optional_lite::optional<tinyusdz::Relationship>::value
                        ((optional<tinyusdz::Relationship> *)(ptStack_18 + 0x808));
    local_364 = Relationship::get_listedit_qual(this_00);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_388,"proxyPrim",&local_389);
    uVar3 = 0;
    anon_unknown_173::print_relationship(&local_360,rel,&local_364,false,&local_388,local_1c + 1);
    std::operator<<(aoStack_198,(string *)&local_360);
    std::__cxx11::string::~string((string *)&local_360);
    std::__cxx11::string::~string((string *)&local_388);
    std::allocator<char>::~allocator((allocator<char> *)&local_389);
  }
  print_xformOps_abi_cxx11_
            (&local_3b0,ptStack_18,
             (vector<tinyusdz::XformOp,_std::allocator<tinyusdz::XformOp>_> *)(ulong)(local_1c + 1),
             uVar3);
  std::operator<<(aoStack_198,(string *)&local_3b0);
  std::__cxx11::string::~string((string *)&local_3b0);
  print_props(&local_3d0,
              (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>_>_>
               *)(ptStack_18 + 0xb88),local_1c + 1);
  std::operator<<(aoStack_198,(string *)&local_3d0);
  std::__cxx11::string::~string((string *)&local_3d0);
  if ((local_1d & 1) != 0) {
    pprint::Indent_abi_cxx11_(&local_3f0,(pprint *)(ulong)local_1c,n_02);
    poVar2 = std::operator<<(aoStack_198,(string *)&local_3f0);
    std::operator<<(poVar2,"}\n");
    std::__cxx11::string::~string((string *)&local_3f0);
  }
  std::__cxx11::stringstream::str();
  std::__cxx11::stringstream::~stringstream(local_1a8);
  return __return_storage_ptr__;
}

Assistant:

std::string to_string(const SkelRoot &root, const uint32_t indent,
                      bool closing_brace) {
  std::stringstream ss;

  ss << pprint::Indent(indent) << to_string(root.spec) << " SkelRoot \""
     << root.name << "\"\n";
  if (root.meta.authored()) {
    ss << pprint::Indent(indent) << "(\n";
    ss << print_prim_metas(root.meta, indent + 1);
    ss << pprint::Indent(indent) << ")\n";
  }
  ss << pprint::Indent(indent) << "{\n";

  ss << print_typed_token_attr(root.visibility, "visibility", indent + 1);
  ss << print_typed_token_attr(root.purpose, "purpose", indent + 1);
  ss << print_typed_attr(root.extent, "extent", indent + 1);

  if (root.proxyPrim) {
    ss << print_relationship(root.proxyPrim.value(),
                             root.proxyPrim.value().get_listedit_qual(),
                             /* custom */ false, "proxyPrim", indent + 1);
  }

  // TODO
  // Skeleton id
  // ss << pprint::Indent(indent) << "skelroot.skeleton_id << "\n"

  ss << print_xformOps(root.xformOps, indent + 1);

  ss << print_props(root.props, indent + 1);

  if (closing_brace) {
    ss << pprint::Indent(indent) << "}\n";
  }

  return ss.str();
}